

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O1

bool baryonyx::itm::
     affect<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
               (solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
                *slv,bit_array *x,row_value *it,int k,int selected,int r_size,longdouble kappa,
               longdouble delta)

{
  longdouble lVar1;
  int iVar2;
  longdouble *plVar3;
  rc_data *prVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  longdouble lVar11;
  
  lVar7 = (long)k;
  plVar3 = (slv->pi)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>.
           _M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
           super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
  lVar1 = plVar3[lVar7];
  if (selected < 0) {
    lVar11 = ((slv->R)._M_t.
              super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
              ._M_t.
              super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
              .
              super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_false>
             ._M_head_impl)->value;
    if (r_size != 0) {
      lVar8 = 0;
      do {
        iVar2 = *(int *)((long)&((slv->R)._M_t.
                                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_false>
                                ._M_head_impl)->id + lVar8);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        plVar3 = (slv->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        plVar3[it[iVar2].value] =
             plVar3[it[iVar2].value] -
             (lVar11 * (longdouble)0.5 * (kappa / ((longdouble)1 - kappa)) + delta);
        lVar8 = lVar8 + 0x20;
      } while ((ulong)(uint)r_size << 5 != lVar8);
    }
  }
  else if ((int)(selected + 1U) < r_size) {
    prVar4 = (slv->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_false>
             ._M_head_impl;
    uVar6 = (ulong)(selected + 1U);
    plVar3[lVar7] = (prVar4[uVar6].value + prVar4[(uint)selected].value) * (longdouble)0.5 + lVar1;
    lVar11 = (prVar4[uVar6].value - prVar4[(uint)selected].value) *
             (kappa / ((longdouble)1 - kappa)) + delta;
    lVar8 = 0x10;
    uVar9 = 0;
    do {
      iVar2 = *(int *)((long)&((slv->R)._M_t.
                               super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                               .
                               super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_false>
                              ._M_head_impl)->value + lVar8);
      bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
      plVar3 = (slv->P)._M_t.super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
               ._M_t.super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
               super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
      plVar3[it[iVar2].value] = plVar3[it[iVar2].value] + lVar11;
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x20;
    } while (uVar6 != uVar9);
    if (r_size != (int)uVar9) {
      lVar10 = (uint)r_size - uVar9;
      do {
        iVar2 = *(int *)((long)&((slv->R)._M_t.
                                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_false>
                                ._M_head_impl)->value + lVar8);
        bit_array_impl::unset(&x->super_bit_array_impl,it[iVar2].column);
        plVar3 = (slv->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        plVar3[it[iVar2].value] = plVar3[it[iVar2].value] - lVar11;
        lVar8 = lVar8 + 0x20;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
  }
  else {
    lVar11 = (slv->R)._M_t.
             super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             ._M_t.
             super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
             .
             super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_false>
             ._M_head_impl[(uint)selected].value;
    if (r_size != 0) {
      lVar8 = 0;
      do {
        iVar2 = *(int *)((long)&((slv->R)._M_t.
                                 super___uniq_ptr_impl<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data[]>_>
                                 .
                                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>::rc_data_*,_false>
                                ._M_head_impl)->id + lVar8);
        bit_array_impl::set(&x->super_bit_array_impl,it[iVar2].column);
        plVar3 = (slv->P)._M_t.
                 super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
                 super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                 super__Head_base<0UL,_long_double_*,_false>._M_head_impl;
        plVar3[it[iVar2].value] =
             plVar3[it[iVar2].value] +
             lVar11 * (longdouble)1.5 * (kappa / ((longdouble)1 - kappa)) + delta;
        lVar8 = lVar8 + 0x20;
      } while ((ulong)(uint)r_size << 5 != lVar8);
    }
  }
  bVar5 = is_valid_constraint<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array>
                    (slv,k,x);
  if (!bVar5) {
    affect<baryonyx::itm::solver_inequalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
              ();
  }
  return (bool)((byte)((byte)((unkuint10)lVar1 >> 0x48) ^
                      (byte)((ushort)*(undefined2 *)
                                      ((long)(slv->pi)._M_t.
                                             super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                                             .super__Head_base<0UL,_long_double_*,_false>.
                                             _M_head_impl + lVar7 * 0x10 + 8) >> 8)) >> 7);
}

Assistant:

bool
affect(Solver& slv,
       Xtype& x,
       Iterator it,
       int k,
       int selected,
       int r_size,
       const Float kappa,
       const Float delta)
{
    constexpr Float one{ 1 };
    constexpr Float two{ 2 };
    constexpr Float middle{ (two + one) / two };

    const auto old_pi = slv.pi[k];

    auto d = delta;

    if (selected < 0) {
        // slv.pi[k] += slv.R[0].value / two;
        d += (kappa / (one - kappa)) * (slv.R[0].value / two);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    } else if (selected + 1 >= r_size) {
        // slv.pi[k] += slv.R[selected].value * middle;
        d += (kappa / (one - kappa)) * (slv.R[selected].value * middle);

        for (int i = 0; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }
    } else {
        slv.pi[k] +=
          ((slv.R[selected].value + slv.R[selected + 1].value) / two);
        d += (kappa / (one - kappa)) *
             (slv.R[selected + 1].value - slv.R[selected].value);

        int i = 0;
        for (; i <= selected; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.unset(var->column);
                slv.P[var->value] -= d;
            } else {
                x.set(var->column);
                slv.P[var->value] += d;
            }
        }

        for (; i != r_size; ++i) {
            auto var = it + slv.R[i].id;

            if (slv.R[i].is_negative_factor()) {
                x.set(var->column);
                slv.P[var->value] += d;
            } else {
                x.unset(var->column);
                slv.P[var->value] -= d;
            }
        }
    }

    // TODO job: develops is_valid_constraint for all the solvers
    bx_expects(is_valid_constraint(slv, k, x));

    return is_signbit_change(old_pi, slv.pi[k]);
}